

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O2

void CVmBifTIO::inputkey(uint argc)

{
  CVmConsoleMain *pCVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  ulong len;
  char c [10];
  int evt;
  char buf [32];
  
  CVmBif::check_argc(argc,0);
  iVar2 = CVmConsole::read_event_script
                    (&G_console_X->super_CVmConsole,&evt,buf,0x20,inputkey::filter,1,
                     (unsigned_long *)0x0);
  if (iVar2 == 0) {
    (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[3])(G_console_X,1);
    if (G_net_config_X == (TadsNetConfig *)0x0) {
      iVar2 = os_getc_raw();
      c[0] = (char)iVar2;
      if (c[0] == '\0') {
        uVar3 = os_getc_raw();
        map_ext_key(buf,uVar3 & 0xff);
      }
      else {
        len = 1;
        while( true ) {
          iVar2 = (*(G_cmap_from_ui_X->super_CCharmap)._vptr_CCharmap[2])(G_cmap_from_ui_X,c,len);
          if ((8 < len) || (iVar2 != 0)) break;
          iVar2 = os_getc_raw();
          c[len] = (char)iVar2;
          len = len + 1;
        }
        c[len] = '\0';
        map_raw_key(buf,c,len);
      }
      CVmConsole::reset_line_count(&G_console_X->super_CVmConsole,0);
      pCVar1 = G_console_X;
      sVar4 = strlen(buf);
      CVmConsole::log_event(&pCVar1->super_CVmConsole,1,buf,sVar4,1);
      CVmBif::retval_str(buf);
    }
    else {
      CVmBif::retval_ui_str("[eof]");
    }
  }
  else {
    CVmBif::retval_ui_str(buf);
    pCVar1 = G_console_X;
    sVar4 = strlen(buf);
    CVmConsole::log_event(&pCVar1->super_CVmConsole,1,buf,sVar4,0);
  }
  return;
}

Assistant:

void CVmBifTIO::inputkey(VMG_ uint argc)
{
    char buf[32];
    char c[10];
    size_t len;
    int evt;
    static const int filter[] = { OS_EVT_KEY };

    /* check arguments */
    check_argc(vmg_ argc, 0);

    /* check for script input */
    if (G_console->read_event_script(
        vmg_ &evt, buf, sizeof(buf),
        filter, sizeof(filter)/sizeof(filter[0]), 0))
    {
        /* we got a key from the script */
        retval_ui_str(vmg_ buf);

        /* log the event */
        G_console->log_event(vmg_ OS_EVT_KEY, buf, strlen(buf), FALSE);

        /* done */
        return;
    }

    /* flush any output */
    G_console->flush_all(vmg_ VM_NL_INPUT);
    
    /* there's no console in web host mode - simply return eof */
    if (G_net_config != 0)
    {
        retval_ui_str(vmg_ "[eof]");
        return;
    }

    /* get a keystroke */
    c[0] = (char)os_getc_raw();
    len = 1;
    
    /* if it's an extended key, map it specially */
    if (c[0] == 0)
    {
        char extc;
        
        /* get the second part of the sequence */
        extc = (char)os_getc_raw();
        
        /* map the extended key */
        map_ext_key(vmg_ buf, (unsigned char)extc);
    }
    else
    {
        /* continue fetching bytes until we have a full character */
        while (!raw_key_complete(vmg_ c, len) && len + 1 < sizeof(c))
        {
            /* 
             *   We don't yet have enough bytes for a complete character, so
             *   read another raw byte.  The keyboard driver should already
             *   have queued up all of the bytes we need to complete the
             *   character sequence, so there should never be a delay from
             *   os_getc_raw() here - it should simply return the next byte
             *   of the sequence immediately.  
             */
            c[len++] = (char)os_getc_raw();
        }
        c[len] = '\0';
        
        /* 
         *   translate the key from the local character set to UTF-8, and map
         *   the extended key code to the portable representation 
         */
        map_raw_key(vmg_ buf, c, len);
    }
    
    /* reset the [MORE] counter */
    G_console->reset_line_count(FALSE);
    
    /* log the event */
    G_console->log_event(vmg_ OS_EVT_KEY, buf, strlen(buf), TRUE);
    
    /* return the string */
    retval_str(vmg_ buf);
}